

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Loop::ComputeLoopStructuredOrder
          (Loop *this,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *ordered_loop_blocks,bool include_pre_header,bool include_merge)

{
  bool bVar1;
  CFG *this_00;
  FeatureManager *pFVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  _List_node_base *p_Var3;
  BasicBlock *bb;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  
  this_00 = IRContext::cfg(this->context_);
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::reserve
            (ordered_loop_blocks,
             (CONCAT71(in_register_00000009,include_merge) & 0xffffffff) +
             (CONCAT71(in_register_00000011,include_pre_header) & 0xffffffff) +
             (this->loop_basic_blocks_)._M_h._M_element_count);
  if (((int)CONCAT71(in_register_00000011,include_pre_header) != 0) &&
     (this->loop_preheader_ != (BasicBlock *)0x0)) {
    std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    push_back(ordered_loop_blocks,&this->loop_preheader_);
  }
  pFVar2 = IRContext::get_feature_mgr(this->context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,Shader);
  if (bVar1) {
    order.
    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl._M_node._M_size = 0;
    order.
    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&order;
    order.
    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&order;
    CFG::ComputeStructuredOrder
              (this_00,this->loop_header_->function_,this->loop_header_,this->loop_merge_,&order);
    p_Var3 = (_List_node_base *)&order;
    while ((p_Var3 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
           p_Var3 != (_List_node_base *)&order &&
           (bb = (BasicBlock *)p_Var3[1]._M_next, bb != this->loop_merge_))) {
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      push_back(ordered_loop_blocks,&bb);
    }
    std::__cxx11::
    _List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::_M_clear
              (&order.
                super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              );
  }
  else {
    order.
    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl._M_node._M_size =
         (size_t)std::
                 _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:485:23)>
                 ::_M_manager;
    order.
    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)ordered_loop_blocks;
    order.
    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
    CFG::ForEachBlockInReversePostOrder
              (this_00,this->loop_header_,(function<void_(spvtools::opt::BasicBlock_*)> *)&order);
    if (order.
        super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
        _M_impl._M_node._M_size != 0) {
      (*(code *)order.
                super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl._M_node._M_size)(&order,&order,3);
    }
  }
  if ((include_merge) && (this->loop_merge_ != (BasicBlock *)0x0)) {
    std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    push_back(ordered_loop_blocks,&this->loop_merge_);
  }
  return;
}

Assistant:

void Loop::ComputeLoopStructuredOrder(
    std::vector<BasicBlock*>* ordered_loop_blocks, bool include_pre_header,
    bool include_merge) const {
  CFG& cfg = *context_->cfg();

  // Reserve the memory: all blocks in the loop + extra if needed.
  ordered_loop_blocks->reserve(GetBlocks().size() + include_pre_header +
                               include_merge);

  if (include_pre_header && GetPreHeaderBlock())
    ordered_loop_blocks->push_back(loop_preheader_);

  bool is_shader =
      context_->get_feature_mgr()->HasCapability(spv::Capability::Shader);
  if (!is_shader) {
    cfg.ForEachBlockInReversePostOrder(
        loop_header_, [ordered_loop_blocks, this](BasicBlock* bb) {
          if (IsInsideLoop(bb)) ordered_loop_blocks->push_back(bb);
        });
  } else {
    // If this is a shader, it is possible that there are unreachable merge and
    // continue blocks that must be copied to retain the structured order.
    // The structured order will include these.
    std::list<BasicBlock*> order;
    cfg.ComputeStructuredOrder(loop_header_->GetParent(), loop_header_,
                               loop_merge_, &order);
    for (BasicBlock* bb : order) {
      if (bb == GetMergeBlock()) {
        break;
      }
      ordered_loop_blocks->push_back(bb);
    }
  }
  if (include_merge && GetMergeBlock())
    ordered_loop_blocks->push_back(loop_merge_);
}